

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O0

StringTree * __thiscall
kj::StringTree::
concat<kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>,kj::StringTree,kj::FixedArray<char,1ul>>
          (StringTree *__return_storage_ptr__,StringTree *this,ArrayPtr<const_char> *params,
          FixedArray<char,_1UL> *params_1,StringTree *params_2,FixedArray<char,_1UL> *params_3)

{
  size_t sVar1;
  ArrayPtr<const_char> *pAVar2;
  FixedArray<char,_1UL> *pFVar3;
  StringTree *pSVar4;
  char *pos;
  FixedArray<char,_1UL> *rest_2;
  size_type extraout_RDX;
  size_type extraout_RDX_00;
  size_type extraout_RDX_01;
  initializer_list<unsigned_long> nums;
  initializer_list<unsigned_long> nums_00;
  initializer_list<unsigned_long> nums_01;
  size_t local_108;
  size_t local_100;
  size_t local_f8;
  size_t local_f0;
  _ *local_e8;
  undefined8 local_e0;
  Array<kj::StringTree::Branch> local_d8;
  size_t local_b0;
  size_t local_a8;
  size_t local_a0;
  size_t local_98;
  _ *local_90;
  undefined8 local_88;
  String local_80;
  size_t local_68;
  size_t local_60;
  size_t local_58;
  size_t local_50;
  _ *local_48;
  undefined8 local_40;
  undefined1 local_31;
  StringTree *local_30;
  FixedArray<char,_1UL> *params_local_3;
  StringTree *params_local_2;
  FixedArray<char,_1UL> *params_local_1;
  ArrayPtr<const_char> *params_local;
  StringTree *result;
  
  local_31 = 0;
  local_30 = params_2;
  params_local_3 = params_1;
  params_local_2 = (StringTree *)params;
  params_local_1 = (FixedArray<char,_1UL> *)this;
  params_local = (ArrayPtr<const_char> *)__return_storage_ptr__;
  StringTree(__return_storage_ptr__);
  local_68 = ArrayPtr<const_char>::size((ArrayPtr<const_char> *)params_local_1);
  local_60 = FixedArray<char,_1UL>::size((FixedArray<char,_1UL> *)params_local_2);
  local_58 = size((StringTree *)params_local_3);
  local_50 = FixedArray<char,_1UL>::size((FixedArray<char,_1UL> *)local_30);
  local_48 = (_ *)&local_68;
  local_40 = 4;
  nums._M_len = extraout_RDX;
  nums._M_array = (iterator)0x4;
  sVar1 = kj::_::sum(local_48,nums);
  __return_storage_ptr__->size_ = sVar1;
  pAVar2 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_local_1);
  local_b0 = flatSize<kj::ArrayPtr<char_const>>(pAVar2);
  pFVar3 = fwd<kj::FixedArray<char,1ul>>((NoInfer<kj::FixedArray<char,_1UL>_> *)params_local_2);
  local_a8 = flatSize<kj::FixedArray<char,1ul>>(pFVar3);
  pSVar4 = fwd<kj::StringTree>((NoInfer<kj::StringTree> *)params_local_3);
  local_a0 = flatSize(pSVar4);
  pFVar3 = fwd<kj::FixedArray<char,1ul>>((NoInfer<kj::FixedArray<char,_1UL>_> *)local_30);
  local_98 = flatSize<kj::FixedArray<char,1ul>>(pFVar3);
  local_90 = (_ *)&local_b0;
  local_88 = 4;
  nums_00._M_len = extraout_RDX_00;
  nums_00._M_array = (iterator)0x4;
  sVar1 = kj::_::sum(local_90,nums_00);
  heapString(&local_80,sVar1);
  String::operator=(&__return_storage_ptr__->text,&local_80);
  String::~String(&local_80);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_local_1);
  local_108 = branchCount<kj::ArrayPtr<char_const>>(pAVar2);
  pFVar3 = fwd<kj::FixedArray<char,1ul>>((NoInfer<kj::FixedArray<char,_1UL>_> *)params_local_2);
  local_100 = branchCount<kj::FixedArray<char,1ul>>(pFVar3);
  pSVar4 = fwd<kj::StringTree>((NoInfer<kj::StringTree> *)params_local_3);
  local_f8 = branchCount(pSVar4);
  pFVar3 = fwd<kj::FixedArray<char,1ul>>((NoInfer<kj::FixedArray<char,_1UL>_> *)local_30);
  local_f0 = branchCount<kj::FixedArray<char,1ul>>(pFVar3);
  local_e8 = (_ *)&local_108;
  local_e0 = 4;
  nums_01._M_len = extraout_RDX_01;
  nums_01._M_array = (iterator)0x4;
  sVar1 = kj::_::sum(local_e8,nums_01);
  heapArray<kj::StringTree::Branch>(&local_d8,sVar1);
  Array<kj::StringTree::Branch>::operator=(&__return_storage_ptr__->branches,&local_d8);
  Array<kj::StringTree::Branch>::~Array(&local_d8);
  pos = String::begin(&__return_storage_ptr__->text);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_local_1);
  pFVar3 = fwd<kj::FixedArray<char,1ul>>((NoInfer<kj::FixedArray<char,_1UL>_> *)params_local_2);
  pSVar4 = fwd<kj::StringTree>((NoInfer<kj::StringTree> *)params_local_3);
  rest_2 = fwd<kj::FixedArray<char,1ul>>((NoInfer<kj::FixedArray<char,_1UL>_> *)local_30);
  fill<kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>,kj::StringTree,kj::FixedArray<char,1ul>>
            (__return_storage_ptr__,pos,0,pAVar2,pFVar3,pSVar4,rest_2);
  return __return_storage_ptr__;
}

Assistant:

StringTree StringTree::concat(Params&&... params) {
  StringTree result;
  result.size_ = _::sum({params.size()...});
  result.text = heapString(
      _::sum({StringTree::flatSize(kj::fwd<Params>(params))...}));
  result.branches = heapArray<StringTree::Branch>(
      _::sum({StringTree::branchCount(kj::fwd<Params>(params))...}));
  result.fill(result.text.begin(), 0, kj::fwd<Params>(params)...);
  return result;
}